

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O1

int Bmc_CollapseIrredundant(Vec_Str_t *vSop,int nCubes,int nVars)

{
  char *pcVar1;
  lit *begin;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  Vec_Int_t *p;
  int *piVar8;
  uint *__ptr;
  void *pvVar9;
  ulong uVar10;
  sat_solver *s;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  
  p = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < nVars - 1U) {
    iVar6 = nVars;
  }
  p->nSize = 0;
  p->nCap = iVar6;
  if (iVar6 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar6 << 2);
  }
  p->pArray = piVar8;
  pcVar12 = vSop->pArray;
  __ptr = (uint *)malloc(0x10);
  uVar11 = 8;
  if (6 < nCubes - 1U) {
    uVar11 = nCubes;
  }
  __ptr[1] = 0;
  *__ptr = uVar11;
  if (uVar11 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar11 << 3);
  }
  *(void **)(__ptr + 2) = pvVar9;
  uVar10 = (long)nVars + 3;
  if (vSop->nSize != nCubes * (int)uVar10 + 1) {
    __assert_fail("Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                  ,0xd5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
  }
  if (*pcVar12 != '\0') {
    lVar14 = (long)(int)__ptr[1];
    uVar11 = *__ptr;
    pvVar9 = *(void **)(__ptr + 2);
    do {
      if ((uint)lVar14 == uVar11) {
        if ((int)uVar11 < 0x10) {
          if (pvVar9 == (void *)0x0) {
            pvVar9 = malloc(0x80);
          }
          else {
            pvVar9 = realloc(pvVar9,0x80);
          }
          uVar11 = 0x10;
        }
        else {
          uVar7 = uVar11 * 2;
          if (SBORROW4(uVar11,uVar7) != 0 < (int)uVar11) {
            uVar11 = uVar7;
            if (pvVar9 == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar7 << 3);
            }
            else {
              pvVar9 = realloc(pvVar9,(ulong)uVar7 << 3);
            }
          }
        }
      }
      *(char **)((long)pvVar9 + lVar14 * 8) = pcVar12;
      lVar14 = lVar14 + 1;
      pcVar1 = pcVar12 + uVar10;
      pcVar12 = pcVar12 + uVar10;
    } while (*pcVar1 != '\0');
    __ptr[1] = (uint)lVar14;
    *__ptr = uVar11;
    *(void **)(__ptr + 2) = pvVar9;
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,nVars);
  uVar11 = __ptr[1];
  uVar15 = uVar11 - 1;
  bVar3 = false;
  uVar7 = uVar11;
  if (0 < (long)(int)uVar11) {
    iVar6 = 0;
    uVar16 = (ulong)uVar15;
    do {
      if ((int)uVar11 < (int)uVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      lVar14 = *(long *)(__ptr + 2);
      pcVar12 = *(char **)(lVar14 + uVar16 * 8);
      p->nSize = 0;
      if (0 < nVars) {
        lVar17 = 0;
        do {
          if (*pcVar12 != '-') {
            Vec_IntPush(p,(uint)(*pcVar12 == '1') + (int)lVar17);
          }
          lVar17 = lVar17 + 2;
          pcVar12 = pcVar12 + 1;
        } while ((ulong)(uint)nVars * 2 != lVar17);
      }
      begin = p->pArray;
      iVar5 = p->nSize;
      iVar4 = sat_solver_solve(s,begin,begin + iVar5,0,0,0,0);
      if (iVar4 == -1) {
        *(undefined8 *)(lVar14 + uVar16 * 8) = 0;
        iVar6 = iVar6 + 1;
      }
      else {
        if (iVar4 != 1) {
          if (iVar4 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                          ,0xef,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
          }
          uVar7 = 1;
          goto LAB_0052895a;
        }
        if (0 < iVar5) {
          lVar14 = 0;
          do {
            if (begin[lVar14] < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf4,"int Abc_LitNot(int)");
            }
            begin[lVar14] = begin[lVar14] ^ 1;
            lVar14 = lVar14 + 1;
          } while (iVar5 != lVar14);
        }
        iVar5 = sat_solver_addclause(s,begin,begin + iVar5);
        if (iVar5 != 1) {
          __assert_fail("status == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                        ,0xf5,"int Bmc_CollapseIrredundant(Vec_Str_t *, int, int)");
        }
      }
      uVar7 = (uint)uVar16;
      bVar3 = 0 < (long)uVar16;
      uVar16 = uVar16 - 1;
    } while (bVar3);
    uVar16 = 0xffffffff;
    uVar7 = 0;
LAB_0052895a:
    uVar15 = (uint)uVar16;
    bVar3 = 0 < iVar6;
  }
  if ((uVar7 == 0) && (bVar3)) {
    if ((int)uVar11 < 1) {
      lVar14 = 0;
      uVar7 = 0;
    }
    else {
      lVar17 = *(long *)(__ptr + 2);
      uVar16 = 1;
      if (1 < (int)uVar10) {
        uVar16 = uVar10 & 0xffffffff;
      }
      lVar14 = 0;
      uVar10 = 0;
      do {
        lVar2 = *(long *)(lVar17 + lVar14 * 8);
        if (lVar2 != 0 && -3 < nVars) {
          iVar6 = (int)uVar10;
          uVar13 = 0;
          do {
            if ((iVar6 < 0) || (vSop->nSize <= iVar6 + (int)uVar13)) goto LAB_00528a6f;
            vSop->pArray[uVar13 + uVar10] = *(char *)(lVar2 + uVar13);
            uVar13 = uVar13 + 1;
          } while (uVar16 != uVar13);
          uVar10 = (ulong)(uint)((int)uVar16 + iVar6);
        }
        uVar7 = (uint)uVar10;
        lVar14 = lVar14 + 1;
      } while (lVar14 != (int)uVar11);
    }
    uVar15 = (uint)lVar14;
    if (((int)uVar7 < 0) || (vSop->nSize <= (int)uVar7)) {
LAB_00528a6f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
    }
    vSop->pArray[uVar7] = '\0';
    if (vSop->nSize <= (int)uVar7) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                    ,0x20a,"void Vec_StrShrink(Vec_Str_t *, int)");
    }
    vSop->nSize = uVar7 + 1;
  }
  sat_solver_delete(s);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  return (int)(uVar15 == 0xffffffff);
}

Assistant:

int Bmc_CollapseIrredundant( Vec_Str_t * vSop, int nCubes, int nVars )
{
    int nBTLimit = 0;
    sat_solver * pSat; 
    int i, k, status, iLit, nRemoved = 0; 
    Vec_Int_t * vLits = Vec_IntAlloc(nVars);
    // collect cubes
    char * pCube, * pSop = Vec_StrArray(vSop);
    Vec_Ptr_t * vCubes = Vec_PtrAlloc(nCubes);
    assert( Vec_StrSize(vSop) == nCubes * (nVars + 3) + 1 );
    Bmc_SopForEachCube( pSop, nVars, pCube )
        Vec_PtrPush( vCubes, pCube );
    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVars );
    // iterate through cubes in the reverse order
    Vec_PtrForEachEntryReverse( char *, vCubes, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < nVars; k++ )
            if ( pCube[k] != '-' )
                Vec_IntPush( vLits, Abc_Var2Lit(k, pCube[k] == '1') );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        // if it does, then it should be added
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat
        {
            Vec_PtrWriteEntry( vCubes, i, NULL );
            nRemoved++;
            continue;
        }
        assert( status == l_True );
        // make a clause out of the cube by complementing its literals
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    //printf( "Approximate irrendundant reduced %d cubes (out of %d).\n", nRemoved, nCubes );
    // cleanup cover
    if ( i == -1 && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        int j = 0;
        Vec_PtrForEachEntry( char *, vCubes, pCube, i )
            if ( pCube != NULL )
                for ( k = 0; k < nVars + 3; k++ )
                    Vec_StrWriteEntry( vSop, j++, pCube[k] );
        Vec_StrWriteEntry( vSop, j++, '\0' );
        Vec_StrShrink( vSop, j );
    }
    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
    Vec_IntFree( vLits );
    return i == -1 ? 1 : 0;
}